

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

int __thiscall Imf_3_4::TiledInputFile::levelHeight(TiledInputFile *this,int ly)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  ArgExc *this_00;
  int32_t levh;
  stringstream _iex_throw_s;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  iVar1 = exr_get_level_sizes(*(this->_ctxt)._ctxt.
                               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,((this->_data).
                                        super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->partNumber,0,ly,0);
  if (iVar1 == 0) {
    return 0;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Error calling levelWidth() on image file \"",0x2a);
  pcVar2 = Context::fileName(&this->_ctxt);
  poVar3 = std::operator<<(local_188,pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
TiledInputFile::levelHeight (int ly) const
{
    int32_t levh = 0;
    if (EXR_ERR_SUCCESS != exr_get_level_sizes (
            _ctxt, _data->partNumber, 0, ly, nullptr, &levh))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling levelWidth() on image "
            "file \""
                << fileName () << "\".");
    }
    return levh;
}